

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O0

void __thiscall spvtools::DiagnosticStream::~DiagnosticStream(DiagnosticStream *this)

{
  spv_message_level_t __args;
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *__args_3;
  string local_38 [36];
  spv_message_level_t local_14;
  DiagnosticStream *pDStack_10;
  spv_message_level_t level;
  DiagnosticStream *this_local;
  
  pDStack_10 = this;
  if ((this->error_ != SPV_FAILED_MATCH) &&
     (bVar1 = std::operator!=(&this->consumer_,(nullptr_t)0x0), bVar1)) {
    local_14 = SPV_MSG_ERROR;
    switch(this->error_) {
    case SPV_SUCCESS:
    case SPV_REQUESTED_TERMINATION:
      local_14 = SPV_MSG_INFO;
      break;
    case SPV_WARNING:
      local_14 = SPV_MSG_WARNING;
      break;
    case SPV_ERROR_INVALID_TABLE:
    case SPV_ERROR_INTERNAL:
    case SPV_UNSUPPORTED:
      local_14 = SPV_MSG_INTERNAL_ERROR;
      break;
    default:
      break;
    case SPV_ERROR_OUT_OF_MEMORY:
      local_14 = SPV_MSG_FATAL;
    }
    lVar2 = std::__cxx11::string::size();
    if (lVar2 != 0) {
      poVar3 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)&this->disassembled_instruction_);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    __args = local_14;
    std::__cxx11::ostringstream::str();
    __args_3 = (char *)std::__cxx11::string::c_str();
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&this->consumer_,__args,"input",&this->position_,__args_3);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::~string((string *)&this->disassembled_instruction_);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&this->consumer_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

DiagnosticStream::~DiagnosticStream() {
  if (error_ != SPV_FAILED_MATCH && consumer_ != nullptr) {
    auto level = SPV_MSG_ERROR;
    switch (error_) {
      case SPV_SUCCESS:
      case SPV_REQUESTED_TERMINATION:  // Essentially success.
        level = SPV_MSG_INFO;
        break;
      case SPV_WARNING:
        level = SPV_MSG_WARNING;
        break;
      case SPV_UNSUPPORTED:
      case SPV_ERROR_INTERNAL:
      case SPV_ERROR_INVALID_TABLE:
        level = SPV_MSG_INTERNAL_ERROR;
        break;
      case SPV_ERROR_OUT_OF_MEMORY:
        level = SPV_MSG_FATAL;
        break;
      default:
        break;
    }
    if (disassembled_instruction_.size() > 0)
      stream_ << std::endl << "  " << disassembled_instruction_ << std::endl;

    consumer_(level, "input", position_, stream_.str().c_str());
  }
}